

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O3

int set_vt_partitioning(AV1_COMP *cpi,MACROBLOCKD *xd,TileInfo *tile,void *data,BLOCK_SIZE bsize,
                       int mi_row,int mi_col,int64_t threshold,BLOCK_SIZE bsize_min,
                       PART_EVAL_STATUS force_split)

{
  byte bVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  MB_MODE_INFO *pMVar4;
  BLOCK_SIZE bsize_00;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  uVar5 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar5];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar5];
  uVar7 = (uint)bVar2;
  uVar11 = (uint)bVar1;
  uVar13 = (uint)(bVar1 >> 1);
  uVar8 = (uint)(bVar2 >> 1);
  uVar12 = uVar8;
  uVar10 = uVar13;
  if (((cpi->common).seq_params)->sb_size == BLOCK_64X64) {
    uVar11 = uVar13 + 1;
    uVar10 = (bVar1 >> 2) + 1;
    if (tile->mi_col_end != (cpi->common).mi_params.mi_cols) {
      uVar11 = (uint)bVar1;
      uVar10 = uVar13;
    }
    if (tile->mi_row_end == (cpi->common).mi_params.mi_rows) {
      uVar7 = uVar8 + 1;
      uVar12 = (bVar2 >> 2) + 1;
    }
  }
  iVar14 = uVar11 + mi_col;
  iVar6 = tile->mi_col_end;
  if (((iVar14 <= iVar6) && (force_split == '\x02')) && ((int)(uVar7 + mi_row) <= tile->mi_row_end))
  {
LAB_0037ca9e:
    if ((cpi->common).mi_params.mi_cols <= mi_col) {
      return 1;
    }
    if ((cpi->common).mi_params.mi_rows <= mi_row) {
      return 1;
    }
    iVar6 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [(cpi->common).mi_params.mi_alloc_bsize]) *
            (cpi->common).mi_params.mi_alloc_stride +
            mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    pMVar4 = (cpi->common).mi_params.mi_alloc;
    (cpi->common).mi_params.mi_grid_base[(cpi->common).mi_params.mi_stride * mi_row + mi_col] =
         pMVar4 + iVar6;
    pMVar4[iVar6].bsize = bsize;
    return 1;
  }
  if (force_split == '\x01') {
    return 0;
  }
  if (bsize == bsize_min) {
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      *(uint *)((long)data + 0xc) =
           (uint)((*data - (int)((ulong)((long)*(int *)((long)data + 4) *
                                        (long)*(int *)((long)data + 4)) >>
                                (*(byte *)((long)data + 8) & 0x3f))) * 0x100) >>
           (*(byte *)((long)data + 8) & 0x1f);
    }
    if (iVar6 < iVar14) {
      return 0;
    }
    if (tile->mi_row_end < (int)(uVar7 + mi_row)) {
      return 0;
    }
    if (threshold <= *(int *)((long)data + 0xc)) {
      return 0;
    }
    goto LAB_0037ca9e;
  }
  if (bsize <= bsize_min) {
    return 0;
  }
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    uVar11 = (uint)((*data - (int)((ulong)((long)*(int *)((long)data + 4) *
                                          (long)*(int *)((long)data + 4)) >>
                                  (*(byte *)((long)data + 8) & 0x3f))) * 0x100) >>
             (*(byte *)((long)data + 8) & 0x1f);
    *(uint *)((long)data + 0xc) = uVar11;
    if (BLOCK_32X32 < bsize) {
      return 0;
    }
    if (threshold * 0x10 < (long)(int)uVar11) {
      return 0;
    }
  }
  if (iVar6 < iVar14) {
    iVar9 = tile->mi_row_end;
  }
  else {
    iVar9 = tile->mi_row_end;
    if (((int)(uVar7 + mi_row) <= iVar9) && (*(int *)((long)data + 0xc) < threshold))
    goto LAB_0037cd76;
  }
  if (((int)(uVar7 + mi_row) <= iVar9) && ((int)(uVar10 + mi_col) <= iVar6)) {
    bsize_00 = get_partition_subsize(bsize,'\x02');
    BVar3 = av1_ss_size_lookup[bsize_00][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y];
    uVar11 = (uint)((*(int *)((long)data + 0x30) -
                    (int)((ulong)((long)*(int *)((long)data + 0x34) *
                                 (long)*(int *)((long)data + 0x34)) >>
                         (*(byte *)((long)data + 0x38) & 0x3f))) * 0x100) >>
             (*(byte *)((long)data + 0x38) & 0x1f);
    *(uint *)((long)data + 0x3c) = uVar11;
    uVar7 = (uint)((*(int *)((long)data + 0x40) -
                   (int)((ulong)((long)*(int *)((long)data + 0x44) *
                                (long)*(int *)((long)data + 0x44)) >>
                        (*(byte *)((long)data + 0x48) & 0x3f))) * 0x100) >>
            (*(byte *)((long)data + 0x48) & 0x1f);
    *(uint *)((long)data + 0x4c) = uVar7;
    if (((int)uVar11 < threshold) && (((int)uVar7 < threshold && (BVar3 != BLOCK_INVALID)))) {
      set_block_size(cpi,mi_row,mi_col,bsize_00);
      mi_col = uVar13 + mi_col;
      bsize = bsize_00;
      goto LAB_0037cd76;
    }
  }
  if (iVar6 < iVar14) {
    return 0;
  }
  if (iVar9 < (int)(uVar12 + mi_row)) {
    return 0;
  }
  bsize = get_partition_subsize(bsize,'\x01');
  BVar3 = av1_ss_size_lookup[bsize][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y];
  uVar11 = (uint)((*(int *)((long)data + 0x10) -
                  (int)((ulong)((long)*(int *)((long)data + 0x14) *
                               (long)*(int *)((long)data + 0x14)) >>
                       (*(byte *)((long)data + 0x18) & 0x3f))) * 0x100) >>
           (*(byte *)((long)data + 0x18) & 0x1f);
  *(uint *)((long)data + 0x1c) = uVar11;
  uVar7 = (uint)((*(int *)((long)data + 0x20) -
                 (int)((ulong)((long)*(int *)((long)data + 0x24) * (long)*(int *)((long)data + 0x24)
                              ) >> (*(byte *)((long)data + 0x28) & 0x3f))) * 0x100) >>
          (*(byte *)((long)data + 0x28) & 0x1f);
  *(uint *)((long)data + 0x2c) = uVar7;
  if (threshold <= (int)uVar11) {
    return 0;
  }
  if (threshold <= (int)uVar7) {
    return 0;
  }
  if (BVar3 == BLOCK_INVALID) {
    return 0;
  }
  set_block_size(cpi,mi_row,mi_col,bsize);
  mi_row = uVar8 + mi_row;
LAB_0037cd76:
  set_block_size(cpi,mi_row,mi_col,bsize);
  return 1;
}

Assistant:

static int set_vt_partitioning(AV1_COMP *cpi, MACROBLOCKD *const xd,
                               const TileInfo *const tile, void *data,
                               BLOCK_SIZE bsize, int mi_row, int mi_col,
                               int64_t threshold, BLOCK_SIZE bsize_min,
                               PART_EVAL_STATUS force_split) {
  AV1_COMMON *const cm = &cpi->common;
  variance_node vt;
  const int block_width = mi_size_wide[bsize];
  const int block_height = mi_size_high[bsize];
  int bs_width_check = block_width;
  int bs_height_check = block_height;
  int bs_width_vert_check = block_width >> 1;
  int bs_height_horiz_check = block_height >> 1;
  // On the right and bottom boundary we only need to check
  // if half the bsize fits, because boundary is extended
  // up to 64. So do this check only for sb_size = 64X64.
  if (cm->seq_params->sb_size == BLOCK_64X64) {
    if (tile->mi_col_end == cm->mi_params.mi_cols) {
      bs_width_check = (block_width >> 1) + 1;
      bs_width_vert_check = (block_width >> 2) + 1;
    }
    if (tile->mi_row_end == cm->mi_params.mi_rows) {
      bs_height_check = (block_height >> 1) + 1;
      bs_height_horiz_check = (block_height >> 2) + 1;
    }
  }

  assert(block_height == block_width);
  tree_to_node(data, bsize, &vt);

  if (mi_col + bs_width_check <= tile->mi_col_end &&
      mi_row + bs_height_check <= tile->mi_row_end &&
      force_split == PART_EVAL_ONLY_NONE) {
    set_block_size(cpi, mi_row, mi_col, bsize);
    return 1;
  }
  if (force_split == PART_EVAL_ONLY_SPLIT) return 0;

  // For bsize=bsize_min (16x16/8x8 for 8x8/4x4 downsampling), select if
  // variance is below threshold, otherwise split will be selected.
  // No check for vert/horiz split as too few samples for variance.
  if (bsize == bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    return 0;
  } else if (bsize > bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    // For key frame: take split for bsize above 32X32 or very high variance.
    if (frame_is_intra_only(cm) &&
        (bsize > BLOCK_32X32 ||
         vt.part_variances->none.variance > (threshold << 4))) {
      return 0;
    }
    // If variance is low, take the bsize (no split).
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    // Check vertical split.
    if (mi_row + bs_height_check <= tile->mi_row_end &&
        mi_col + bs_width_vert_check <= tile->mi_col_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_VERT);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->vert[0]);
      get_variance(&vt.part_variances->vert[1]);
      if (vt.part_variances->vert[0].variance < threshold &&
          vt.part_variances->vert[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row, mi_col + block_width / 2, subsize);
        return 1;
      }
    }
    // Check horizontal split.
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_horiz_check <= tile->mi_row_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->horz[0]);
      get_variance(&vt.part_variances->horz[1]);
      if (vt.part_variances->horz[0].variance < threshold &&
          vt.part_variances->horz[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row + block_height / 2, mi_col, subsize);
        return 1;
      }
    }
    return 0;
  }
  return 0;
}